

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall
MlmWrap::receiveMailbox(MlmWrap *this,char *sender,char *subject,char *format,TrodesMsg *msg)

{
  int iVar1;
  char *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  int rc;
  TrodesMsg *in_stack_00000038;
  MlmWrap *in_stack_00000040;
  char *in_stack_00000048;
  MlmWrap *in_stack_00000050;
  TrodesMsg *in_stack_00000068;
  MlmWrap *in_stack_00000070;
  TrodesMsg *in_stack_00000880;
  char *in_stack_00000888;
  MlmWrap *in_stack_00000890;
  int local_2c;
  
  iVar1 = strcmp(in_RDX,"cmd");
  if (iVar1 == 0) {
    local_2c = processMlmCommandMsg(in_stack_00000040,in_stack_00000038);
  }
  else {
    iVar1 = strcmp(in_RDX,"info_rep");
    if (iVar1 == 0) {
      local_2c = processMlmReplyMsg(in_stack_00000070,in_stack_00000068);
    }
    else {
      iVar1 = strcmp(in_RDX,"info_req");
      if (iVar1 == 0) {
        local_2c = processMlmRequestMsg
                             (in_stack_00000050,in_stack_00000048,(TrodesMsg *)in_stack_00000040);
      }
      else {
        iVar1 = strcmp(in_RDX,"network_note");
        if (iVar1 == 0) {
          local_2c = processMlmNetworkNotification
                               (in_stack_00000890,in_stack_00000888,in_stack_00000880);
        }
        else {
          local_2c = (**(code **)(*in_RDI + 0x38))(in_RDI,in_RSI,in_RDX,in_R8);
        }
      }
    }
  }
  return local_2c;
}

Assistant:

int MlmWrap::receiveMailbox(const char *sender, const char *subject, const char *format, TrodesMsg &msg) {
    int rc = 0;
    if (streq(subject, TRODES_CMD)) { //direct message commands
        rc = processMlmCommandMsg(msg);
    }
    else if (streq(subject, TRODES_INFO_REP)) { //mlm processes reply messages in a standardized way
        rc = processMlmReplyMsg(msg);
    }
    else if (streq(subject,TRODES_INFO_REQ)) { //mlm processes request messages in a standardized way
        rc = processMlmRequestMsg(sender, msg);
    }
    else if (streq(subject,TRODES_NETWORK_NOTIFICATION)) { //mlm processes internal network notifications
        rc = processMlmNetworkNotification(sender, msg);
    }
    else{
        rc = processOtherMsg(sender, subject, msg); //if the type is unknown, send it to the processOtherMsg function
    }
    return(rc);
}